

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

void * rw::mustmalloc_h(size_t sz,uint32 hint)

{
  void *pvVar1;
  size_t sVar2;
  undefined8 extraout_RDX;
  undefined4 in_register_00000034;
  ulong uVar3;
  ulong uVar4;
  char *__s;
  
  uVar3 = CONCAT44(in_register_00000034,hint);
  __s = (char *)sz;
  pvVar1 = (void *)(*Engine::memfuncs)();
  if (sz == 0 || pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  mustmalloc_h();
  uVar4 = uVar3;
  pvVar1 = (void *)(*DAT_00149dd8)();
  if (uVar3 == 0 || pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  mustrealloc_h();
  sVar2 = strlen(__s);
  allocLocation = extraout_RDX;
  pvVar1 = (void *)(*Engine::memfuncs)(sVar2 + 1,uVar4 & 0xffffffff);
  if (pvVar1 != (void *)0x0) {
    pvVar1 = memcpy(pvVar1,__s,sVar2 + 1);
    return pvVar1;
  }
  return (void *)0x0;
}

Assistant:

void *mustmalloc_h(size_t sz, uint32 hint)
{
	void *ret;
	ret = Engine::memfuncs.rwmalloc(sz, hint);
	if(ret || sz == 0)
		return ret;
	fprintf(stderr, "Error: out of memory\n");
	exit(1);
	return nil;
}